

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.cpp
# Opt level: O2

bool __thiscall cashew::Ref::operator==(Ref *this,IString *str)

{
  bool bVar1;
  
  if (this->inst->type == String) {
    bVar1 = (this->inst->field_1).str.str._M_str == (str->str)._M_str;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Ref::operator==(const IString& str) {
  return get()->isString() && get()->str == str;
}